

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

bool __thiscall argh::parser::got_flag(parser *this,string *name)

{
  bool bVar1;
  undefined1 local_48 [32];
  _Self local_28;
  _Self local_20;
  _Base_ptr local_18;
  string *name_local;
  parser *this_local;
  
  local_18 = (_Base_ptr)name;
  name_local = (string *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->flags_);
  trim_leading_dashes((parser *)local_48,(string *)this);
  local_28._M_node =
       (_Base_ptr)
       std::
       multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->flags_,(key_type *)local_48);
  bVar1 = std::operator!=(&local_20,&local_28);
  std::__cxx11::string::~string((string *)local_48);
  return bVar1;
}

Assistant:

inline bool argh::parser::got_flag(std::string const& name) const
   {
      return flags_.end() != flags_.find(trim_leading_dashes(name));
   }